

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_backend.c
# Opt level: O0

int ec_key_point_format_fromdata(EC_KEY *ec,OSSL_PARAM *params)

{
  int iVar1;
  OSSL_PARAM *func;
  undefined8 in_RSI;
  EC_KEY *in_RDI;
  int format;
  OSSL_PARAM *p;
  undefined4 in_stack_ffffffffffffffd8;
  point_conversion_form_t cform;
  OSSL_PARAM *in_stack_ffffffffffffffe0;
  int line;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  line = (int)((ulong)in_RSI >> 0x20);
  cform = 0xffffffff;
  func = OSSL_PARAM_locate_const
                   (in_stack_ffffffffffffffe0,(char *)CONCAT44(0xffffffff,in_stack_ffffffffffffffd8)
                   );
  if (func != (OSSL_PARAM *)0x0) {
    iVar1 = ossl_ec_pt_format_param2id
                      ((OSSL_PARAM *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (int *)in_RDI);
    if (iVar1 == 0) {
      ERR_new();
      ERR_set_debug((char *)in_RDI,line,(char *)func);
      ERR_set_error(0x10,0x68,(char *)0x0);
      return 0;
    }
    EC_KEY_set_conv_form(in_RDI,cform);
  }
  return 1;
}

Assistant:

static int ec_key_point_format_fromdata(EC_KEY *ec, const OSSL_PARAM params[])
{
    const OSSL_PARAM *p;
    int format = -1;

    p = OSSL_PARAM_locate_const(params, OSSL_PKEY_PARAM_EC_POINT_CONVERSION_FORMAT);
    if (p != NULL) {
        if (!ossl_ec_pt_format_param2id(p, &format)) {
            ECerr(0, EC_R_INVALID_FORM);
            return 0;
        }
        EC_KEY_set_conv_form(ec, format);
    }
    return 1;
}